

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

int Vector2Equals(Vector2 p,Vector2 q)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = ABS(p.x);
  fVar4 = ABS(q.x);
  fVar2 = fVar4;
  if (fVar4 <= fVar3) {
    fVar2 = fVar3;
  }
  fVar2 = (float)(~-(uint)NAN(fVar3) & (uint)fVar2 | -(uint)NAN(fVar3) & (uint)fVar4);
  if (fVar2 <= 1.0) {
    fVar2 = 1.0;
  }
  uVar1 = 0;
  if (ABS(p.x - q.x) <= fVar2 * 1e-06) {
    fVar3 = ABS(p.y);
    fVar4 = ABS(q.y);
    fVar2 = fVar4;
    if (fVar4 <= fVar3) {
      fVar2 = fVar3;
    }
    fVar2 = (float)(~-(uint)NAN(fVar3) & (uint)fVar2 | -(uint)NAN(fVar3) & (uint)fVar4);
    if (fVar2 <= 1.0) {
      fVar2 = 1.0;
    }
    uVar1 = (uint)(ABS(p.y - q.y) <= fVar2 * 1e-06);
  }
  return uVar1;
}

Assistant:

RMAPI int Vector2Equals(Vector2 p, Vector2 q)
{
#if !defined(EPSILON)
    #define EPSILON 0.000001f
#endif

    int result = ((fabsf(p.x - q.x)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.x), fabsf(q.x))))) &&
                  ((fabsf(p.y - q.y)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.y), fabsf(q.y)))));

    return result;
}